

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::isVariableTestedBefore(Analyzer *this,Node *variable)

{
  bool bVar1;
  Node *subnode;
  reference ppNVar2;
  Analyzer *in_RSI;
  long in_RDI;
  Node *condition;
  size_t i;
  Node *nextNode;
  value_type node;
  
  node = (value_type)0x0;
  subnode = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::size
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30));
  do {
    subnode = (Node *)((long)&subnode[-1].children.
                              super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 7);
    ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                         (size_type)subnode);
    if (*ppNVar2 == (value_type)0x0) {
      return false;
    }
    ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                         (size_type)subnode);
    if (((((*ppNVar2)->nodeType == PNT_IF_ELSE) ||
         (ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                               (size_type)subnode), (*ppNVar2)->nodeType == PNT_TERNARY_OP)) ||
        (ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                             ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                              (size_type)subnode), (*ppNVar2)->nodeType == PNT_WHILE_LOOP)) ||
       ((ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                             ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                              (size_type)subnode), (*ppNVar2)->nodeType == PNT_BINARY_OP &&
        ((ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                               (size_type)subnode), (*ppNVar2)->tok->type == TK_AND ||
         (ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                               (size_type)subnode), (*ppNVar2)->tok->type == TK_OR)))))) {
      ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                           (size_type)subnode);
      ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&(*ppNVar2)->children,0);
      if ((*ppNVar2 != node) && (bVar1 = isSubnodeExistsInNode(in_RSI,node,subnode), bVar1)) {
        return true;
      }
    }
    ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                        ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x30),
                         (size_type)subnode);
    node = *ppNVar2;
  } while( true );
}

Assistant:

bool isVariableTestedBefore(Node * variable)
  {
    Node * nextNode = nullptr;
    for (size_t i = nodePath.size() - 1; nodePath[i] != nullptr; nextNode = nodePath[i], i--)
    {
      if (nodePath[i]->nodeType == PNT_IF_ELSE || nodePath[i]->nodeType == PNT_TERNARY_OP ||
        nodePath[i]->nodeType == PNT_WHILE_LOOP ||
        (nodePath[i]->nodeType == PNT_BINARY_OP && (nodePath[i]->tok.type == TK_AND || nodePath[i]->tok.type == TK_OR)))
      {
        Node * condition = nodePath[i]->children[0];
        if (condition != nextNode && isSubnodeExistsInNode(condition, variable))
          return true;
      }
    }

    return false;
  }